

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_infix(FuncState *fs,BinOpr op,expdesc *v)

{
  if (op < OPR_CONCAT) {
    if (((v->t == -1) && (v->f == -1)) && (0xfffffffd < v->k - VNONRELOC)) {
      return;
    }
  }
  else {
    if (op == OPR_CONCAT) {
      luaK_exp2nextreg(fs,v);
      return;
    }
    if (op == OPR_OR) {
      luaK_goiffalse(fs,v);
      return;
    }
    if (op == OPR_AND) {
      luaK_goiftrue(fs,v);
      return;
    }
  }
  luaK_exp2RK(fs,v);
  return;
}

Assistant:

void luaK_infix (FuncState *fs, BinOpr op, expdesc *v) {
  switch (op) {
    case OPR_AND: {
      luaK_goiftrue(fs, v);
      break;
    }
    case OPR_OR: {
      luaK_goiffalse(fs, v);
      break;
    }
    case OPR_CONCAT: {
      luaK_exp2nextreg(fs, v);  /* operand must be on the 'stack' */
      break;
    }
    case OPR_ADD: case OPR_SUB:
    case OPR_MUL: case OPR_DIV: case OPR_IDIV:
    case OPR_MOD: case OPR_POW:
    case OPR_BAND: case OPR_BOR: case OPR_BXOR:
    case OPR_SHL: case OPR_SHR: {
      if (!tonumeral(v, NULL)) luaK_exp2RK(fs, v);
      break;
    }
    default: {
      luaK_exp2RK(fs, v);
      break;
    }
  }
}